

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span> *
__thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::get_span_impl(error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
                *__return_storage_ptr__,
               buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *this,descriptor<pstore::details::posix_descriptor_traits> *io,byte_span *sp)

{
  uchar uVar1;
  long __n;
  bool bVar2;
  index_type iVar3;
  uchar *puVar4;
  reference peVar5;
  descriptor<pstore::details::posix_descriptor_traits> *rhs;
  type *lhs;
  long *plVar6;
  pointer peVar7;
  pointer peVar8;
  pointer peVar9;
  error_code eVar10;
  byte local_172;
  span<unsigned_char,__1L> local_158;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_140;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_130;
  index_type local_120;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_118;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_108;
  difference_type local_f8;
  long local_f0;
  long to_copy;
  span<unsigned_char,__1L> local_d8;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_c0;
  type *local_b0;
  type *end;
  uint local_98;
  error_category *local_90;
  error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  local_88;
  undefined1 local_68 [8];
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<std::uint8_t>::iterator>
  x;
  pointer local_40;
  undefined1 local_38 [8];
  byte_span available;
  byte_span *sp_local;
  descriptor<pstore::details::posix_descriptor_traits> *io_local;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *this_local;
  
  local_38 = (undefined1  [8])(sp->storage_).super_extent_type<_1L>.size_;
  available.storage_.super_extent_type<_1L>.size_ = (index_type)(sp->storage_).data_;
  available.storage_.data_ = (pointer)sp;
  bVar2 = pstore::maybe::operator_cast_to_bool((maybe *)&this->push_);
  if ((bVar2) &&
     (iVar3 = pstore::gsl::span<unsigned_char,_-1L>::size
                        ((span<unsigned_char,__1L> *)available.storage_.data_), 0 < iVar3)) {
    puVar4 = maybe<unsigned_char,_void>::operator*(&this->push_);
    uVar1 = *puVar4;
    peVar5 = pstore::gsl::span<unsigned_char,_-1L>::operator[]
                       ((span<unsigned_char,__1L> *)available.storage_.data_,0);
    *peVar5 = uVar1;
    maybe<unsigned_char,_void>::reset(&this->push_);
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         pstore::gsl::span<unsigned_char,_-1L>::subspan((span<unsigned_char,__1L> *)local_38,1,-1);
    local_38 = (undefined1  [8])x._24_8_;
    available.storage_.super_extent_type<_1L>.size_ = (index_type)local_40;
  }
  do {
    bVar2 = pstore::gsl::span<unsigned_char,_-1L>::empty((span<unsigned_char,__1L> *)local_38);
    local_172 = 0;
    if (!bVar2) {
      local_172 = this->is_eof_ ^ 0xff;
    }
    if ((local_172 & 1) == 0) {
      peVar7 = pstore::gsl::span<unsigned_char,_-1L>::data
                         ((span<unsigned_char,__1L> *)available.storage_.data_);
      peVar8 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38);
      peVar9 = pstore::gsl::span<unsigned_char,_-1L>::data
                         ((span<unsigned_char,__1L> *)available.storage_.data_);
      pstore::gsl::span<unsigned_char,_-1L>::span(&local_158,peVar7,(long)peVar8 - (long)peVar9);
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
      ::
      error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>
                ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                  *)__return_storage_ptr__,io,&local_158);
      return __return_storage_ptr__;
    }
    bVar2 = pstore::gsl::details::operator==(&this->pos_,&this->end_);
    if (bVar2) {
      (*this->refill_)(&local_88,io,&this->span_);
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
      ::
      error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>,void>
                ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                  *)local_68,&local_88);
      error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or(&local_88);
      bVar2 = pstore::error_or::operator_cast_to_bool((error_or *)local_68);
      if (bVar2) {
        rhs = get<0ul,pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                        ((error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char>,_false>_>
                          *)local_68);
        pstore::details::descriptor<pstore::details::posix_descriptor_traits>::operator=(io,rhs);
        lhs = get<1ul,pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                        ((error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char>,_false>_>
                          *)local_68);
        local_b0 = lhs;
        pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_c0);
        bVar2 = pstore::gsl::details::operator==(lhs,&local_c0);
        if (bVar2) {
          this->is_eof_ = true;
          peVar7 = pstore::gsl::span<unsigned_char,_-1L>::data
                             ((span<unsigned_char,__1L> *)available.storage_.data_);
          peVar8 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38)
          ;
          peVar9 = pstore::gsl::span<unsigned_char,_-1L>::data
                             ((span<unsigned_char,__1L> *)available.storage_.data_);
          pstore::gsl::span<unsigned_char,_-1L>::span(&local_d8,peVar7,(long)peVar8 - (long)peVar9);
          error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
          ::
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>
                    ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                      *)__return_storage_ptr__,io,&local_d8);
          end._0_4_ = 1;
        }
        else {
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          operator=(&this->end_,local_b0);
          pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&to_copy);
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          operator=(&this->pos_,
                    (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&to_copy);
          end._0_4_ = 0;
        }
      }
      else {
        eVar10 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                 ::get_error((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                              *)local_68);
        local_98 = eVar10._M_value;
        eVar10._4_4_ = 0;
        eVar10._M_value = local_98;
        local_90 = eVar10._M_cat;
        error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<unsigned_char,_-1L>_>_>
        ::error_or(__return_storage_ptr__,eVar10);
        end._0_4_ = 1;
      }
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                   *)local_68);
      if ((int)end != 0) {
        return __return_storage_ptr__;
      }
    }
    check_invariants(this);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_108,&this->pos_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_118,&this->end_);
    local_f8 = std::
               distance<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                         (&local_108,&local_118);
    local_120 = pstore::gsl::span<unsigned_char,_-1L>::size((span<unsigned_char,__1L> *)local_38);
    plVar6 = std::min<long>(&local_f8,&local_120);
    local_f0 = *plVar6;
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_130,&this->pos_);
    __n = local_f0;
    peVar7 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_38);
    std::
    copy_n<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,long,unsigned_char*>
              (&local_130,__n,peVar7);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
              (&this->pos_,local_f0);
    local_140 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                pstore::gsl::span<unsigned_char,_-1L>::subspan
                          ((span<unsigned_char,__1L> *)local_38,local_f0,-1);
    local_38 = (undefined1  [8])local_140.super_extent_type<_1L>.size_;
    available.storage_.super_extent_type<_1L>.size_ = (index_type)local_140.data_;
  } while( true );
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }